

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_initialize(REF_CELL ref_cell,REF_CELL_TYPE type)

{
  REF_INT *pRVar1;
  REF_CELL_TYPE type_local;
  REF_CELL ref_cell_local;
  
  ref_cell->type = type;
  ref_cell->last_node_is_an_id = 0;
  if (ref_cell->type < REF_CELL_TET) {
    ref_cell->last_node_is_an_id = 1;
  }
  else {
    if (7 < ref_cell->type - REF_CELL_TET) {
      return 6;
    }
    ref_cell->last_node_is_an_id = 0;
  }
  switch(ref_cell->type) {
  case REF_CELL_EDG:
    ref_cell->node_per = 2;
    break;
  case REF_CELL_ED2:
    ref_cell->node_per = 3;
    break;
  case REF_CELL_ED3:
    ref_cell->node_per = 4;
    break;
  case REF_CELL_TRI:
    ref_cell->node_per = 3;
    break;
  case REF_CELL_TR2:
    ref_cell->node_per = 6;
    break;
  case REF_CELL_TR3:
    ref_cell->node_per = 10;
    break;
  case REF_CELL_QUA:
    ref_cell->node_per = 4;
    break;
  case REF_CELL_QU2:
    ref_cell->node_per = 9;
    break;
  case REF_CELL_TET:
    ref_cell->node_per = 4;
    break;
  case REF_CELL_PYR:
    ref_cell->node_per = 5;
    break;
  case REF_CELL_PRI:
    ref_cell->node_per = 6;
    break;
  case REF_CELL_HEX:
    ref_cell->node_per = 8;
    break;
  case REF_CELL_TE2:
    ref_cell->node_per = 10;
    break;
  case REF_CELL_PY2:
    ref_cell->node_per = 0xe;
    break;
  case REF_CELL_PR2:
    ref_cell->node_per = 0x12;
    break;
  case REF_CELL_HE2:
    ref_cell->node_per = 0x1b;
    break;
  default:
    return 6;
  }
  ref_cell->size_per = (ref_cell->node_per + 1) - (uint)(ref_cell->last_node_is_an_id == 0);
  switch(ref_cell->type) {
  case REF_CELL_EDG:
  case REF_CELL_ED2:
  case REF_CELL_ED3:
    ref_cell->edge_per = 1;
    break;
  case REF_CELL_TRI:
  case REF_CELL_TR2:
  case REF_CELL_TR3:
    ref_cell->edge_per = 3;
    break;
  case REF_CELL_QUA:
  case REF_CELL_QU2:
    ref_cell->edge_per = 4;
    break;
  case REF_CELL_TET:
  case REF_CELL_TE2:
    ref_cell->edge_per = 6;
    break;
  case REF_CELL_PYR:
  case REF_CELL_PY2:
    ref_cell->edge_per = 8;
    break;
  case REF_CELL_PRI:
  case REF_CELL_PR2:
    ref_cell->edge_per = 9;
    break;
  case REF_CELL_HEX:
  case REF_CELL_HE2:
    ref_cell->edge_per = 0xc;
    break;
  default:
    ref_cell->edge_per = 0;
  }
  ref_cell->e2n = (REF_INT *)0x0;
  if (0 < ref_cell->edge_per) {
    if (ref_cell->edge_per * 2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x99,
             "ref_cell_initialize","malloc ref_cell->e2n of REF_INT negative");
      return 1;
    }
    pRVar1 = (REF_INT *)malloc((long)(ref_cell->edge_per << 1) << 2);
    ref_cell->e2n = pRVar1;
    if (ref_cell->e2n == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x99,
             "ref_cell_initialize","malloc ref_cell->e2n of REF_INT NULL");
      return 2;
    }
  }
  switch(ref_cell->type) {
  case REF_CELL_EDG:
  case REF_CELL_ED2:
  case REF_CELL_ED3:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    break;
  case REF_CELL_TRI:
  case REF_CELL_TR2:
  case REF_CELL_TR3:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 1;
    ref_cell->e2n[3] = 2;
    ref_cell->e2n[4] = 2;
    ref_cell->e2n[5] = 0;
    break;
  case REF_CELL_QUA:
  case REF_CELL_QU2:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 1;
    ref_cell->e2n[3] = 2;
    ref_cell->e2n[4] = 2;
    ref_cell->e2n[5] = 3;
    ref_cell->e2n[6] = 3;
    ref_cell->e2n[7] = 0;
    break;
  case REF_CELL_TET:
  case REF_CELL_TE2:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 0;
    ref_cell->e2n[3] = 2;
    ref_cell->e2n[4] = 0;
    ref_cell->e2n[5] = 3;
    ref_cell->e2n[6] = 1;
    ref_cell->e2n[7] = 2;
    ref_cell->e2n[8] = 1;
    ref_cell->e2n[9] = 3;
    ref_cell->e2n[10] = 2;
    ref_cell->e2n[0xb] = 3;
    break;
  case REF_CELL_PYR:
  case REF_CELL_PY2:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 0;
    ref_cell->e2n[3] = 2;
    ref_cell->e2n[4] = 0;
    ref_cell->e2n[5] = 3;
    ref_cell->e2n[6] = 1;
    ref_cell->e2n[7] = 2;
    ref_cell->e2n[8] = 1;
    ref_cell->e2n[9] = 4;
    ref_cell->e2n[10] = 2;
    ref_cell->e2n[0xb] = 3;
    ref_cell->e2n[0xc] = 2;
    ref_cell->e2n[0xd] = 4;
    ref_cell->e2n[0xe] = 3;
    ref_cell->e2n[0xf] = 4;
    break;
  case REF_CELL_PRI:
  case REF_CELL_PR2:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 0;
    ref_cell->e2n[3] = 2;
    ref_cell->e2n[4] = 0;
    ref_cell->e2n[5] = 3;
    ref_cell->e2n[6] = 1;
    ref_cell->e2n[7] = 2;
    ref_cell->e2n[8] = 1;
    ref_cell->e2n[9] = 4;
    ref_cell->e2n[10] = 2;
    ref_cell->e2n[0xb] = 5;
    ref_cell->e2n[0xc] = 3;
    ref_cell->e2n[0xd] = 4;
    ref_cell->e2n[0xe] = 3;
    ref_cell->e2n[0xf] = 5;
    ref_cell->e2n[0x10] = 4;
    ref_cell->e2n[0x11] = 5;
    break;
  case REF_CELL_HEX:
  case REF_CELL_HE2:
    *ref_cell->e2n = 0;
    ref_cell->e2n[1] = 1;
    ref_cell->e2n[2] = 0;
    ref_cell->e2n[3] = 3;
    ref_cell->e2n[4] = 0;
    ref_cell->e2n[5] = 4;
    ref_cell->e2n[6] = 1;
    ref_cell->e2n[7] = 2;
    ref_cell->e2n[8] = 1;
    ref_cell->e2n[9] = 5;
    ref_cell->e2n[10] = 2;
    ref_cell->e2n[0xb] = 3;
    ref_cell->e2n[0xc] = 2;
    ref_cell->e2n[0xd] = 6;
    ref_cell->e2n[0xe] = 3;
    ref_cell->e2n[0xf] = 7;
    ref_cell->e2n[0x10] = 4;
    ref_cell->e2n[0x11] = 5;
    ref_cell->e2n[0x12] = 4;
    ref_cell->e2n[0x13] = 7;
    ref_cell->e2n[0x14] = 5;
    ref_cell->e2n[0x15] = 6;
    ref_cell->e2n[0x16] = 6;
    ref_cell->e2n[0x17] = 7;
    break;
  default:
    return 6;
  }
  switch(ref_cell->type) {
  case REF_CELL_EDG:
  case REF_CELL_ED2:
  case REF_CELL_ED3:
    ref_cell->face_per = 0;
    break;
  case REF_CELL_TRI:
  case REF_CELL_TR2:
  case REF_CELL_TR3:
    ref_cell->face_per = 1;
    break;
  case REF_CELL_QUA:
  case REF_CELL_QU2:
    ref_cell->face_per = 1;
    break;
  case REF_CELL_TET:
  case REF_CELL_TE2:
    ref_cell->face_per = 4;
    break;
  case REF_CELL_PYR:
  case REF_CELL_PY2:
    ref_cell->face_per = 5;
    break;
  case REF_CELL_PRI:
  case REF_CELL_PR2:
    ref_cell->face_per = 5;
    break;
  case REF_CELL_HEX:
  case REF_CELL_HE2:
    ref_cell->face_per = 6;
    break;
  default:
    return 6;
  }
  ref_cell->f2n = (REF_INT *)0x0;
  if (0 < ref_cell->face_per) {
    if (ref_cell->face_per * 4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x132,
             "ref_cell_initialize","malloc ref_cell->f2n of REF_INT negative");
      return 1;
    }
    pRVar1 = (REF_INT *)malloc((long)(ref_cell->face_per << 2) << 2);
    ref_cell->f2n = pRVar1;
    if (ref_cell->f2n == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x132,
             "ref_cell_initialize","malloc ref_cell->f2n of REF_INT NULL");
      return 2;
    }
  }
  switch(ref_cell->type) {
  case REF_CELL_EDG:
  case REF_CELL_ED2:
  case REF_CELL_ED3:
    break;
  case REF_CELL_TRI:
  case REF_CELL_TR2:
  case REF_CELL_TR3:
    *ref_cell->f2n = 0;
    ref_cell->f2n[1] = 1;
    ref_cell->f2n[2] = 2;
    ref_cell->f2n[3] = 0;
    break;
  case REF_CELL_QUA:
  case REF_CELL_QU2:
    *ref_cell->f2n = 0;
    ref_cell->f2n[1] = 1;
    ref_cell->f2n[2] = 2;
    ref_cell->f2n[3] = 3;
    break;
  case REF_CELL_TET:
  case REF_CELL_TE2:
    *ref_cell->f2n = 1;
    ref_cell->f2n[1] = 3;
    ref_cell->f2n[2] = 2;
    ref_cell->f2n[3] = *ref_cell->f2n;
    ref_cell->f2n[4] = 0;
    ref_cell->f2n[5] = 2;
    ref_cell->f2n[6] = 3;
    ref_cell->f2n[7] = ref_cell->f2n[4];
    ref_cell->f2n[8] = 0;
    ref_cell->f2n[9] = 3;
    ref_cell->f2n[10] = 1;
    ref_cell->f2n[0xb] = ref_cell->f2n[8];
    ref_cell->f2n[0xc] = 0;
    ref_cell->f2n[0xd] = 1;
    ref_cell->f2n[0xe] = 2;
    ref_cell->f2n[0xf] = ref_cell->f2n[0xc];
    break;
  case REF_CELL_PYR:
  case REF_CELL_PY2:
    *ref_cell->f2n = 0;
    ref_cell->f2n[1] = 1;
    ref_cell->f2n[2] = 2;
    ref_cell->f2n[3] = *ref_cell->f2n;
    ref_cell->f2n[4] = 1;
    ref_cell->f2n[5] = 4;
    ref_cell->f2n[6] = 2;
    ref_cell->f2n[7] = ref_cell->f2n[4];
    ref_cell->f2n[8] = 2;
    ref_cell->f2n[9] = 4;
    ref_cell->f2n[10] = 3;
    ref_cell->f2n[0xb] = ref_cell->f2n[8];
    ref_cell->f2n[0xc] = 0;
    ref_cell->f2n[0xd] = 2;
    ref_cell->f2n[0xe] = 3;
    ref_cell->f2n[0xf] = ref_cell->f2n[0xc];
    ref_cell->f2n[0x10] = 0;
    ref_cell->f2n[0x11] = 3;
    ref_cell->f2n[0x12] = 4;
    ref_cell->f2n[0x13] = 1;
    break;
  case REF_CELL_PRI:
  case REF_CELL_PR2:
    *ref_cell->f2n = 0;
    ref_cell->f2n[1] = 3;
    ref_cell->f2n[2] = 4;
    ref_cell->f2n[3] = 1;
    ref_cell->f2n[4] = 1;
    ref_cell->f2n[5] = 4;
    ref_cell->f2n[6] = 5;
    ref_cell->f2n[7] = 2;
    ref_cell->f2n[8] = 0;
    ref_cell->f2n[9] = 2;
    ref_cell->f2n[10] = 5;
    ref_cell->f2n[0xb] = 3;
    ref_cell->f2n[0xc] = 0;
    ref_cell->f2n[0xd] = 1;
    ref_cell->f2n[0xe] = 2;
    ref_cell->f2n[0xf] = ref_cell->f2n[0xc];
    ref_cell->f2n[0x10] = 3;
    ref_cell->f2n[0x11] = 5;
    ref_cell->f2n[0x12] = 4;
    ref_cell->f2n[0x13] = ref_cell->f2n[0x10];
    break;
  case REF_CELL_HEX:
  case REF_CELL_HE2:
    *ref_cell->f2n = 0;
    ref_cell->f2n[1] = 3;
    ref_cell->f2n[2] = 7;
    ref_cell->f2n[3] = 4;
    ref_cell->f2n[4] = 1;
    ref_cell->f2n[5] = 5;
    ref_cell->f2n[6] = 6;
    ref_cell->f2n[7] = 2;
    ref_cell->f2n[8] = 0;
    ref_cell->f2n[9] = 4;
    ref_cell->f2n[10] = 5;
    ref_cell->f2n[0xb] = 1;
    ref_cell->f2n[0xc] = 2;
    ref_cell->f2n[0xd] = 6;
    ref_cell->f2n[0xe] = 7;
    ref_cell->f2n[0xf] = 3;
    ref_cell->f2n[0x10] = 0;
    ref_cell->f2n[0x11] = 1;
    ref_cell->f2n[0x12] = 2;
    ref_cell->f2n[0x13] = 3;
    ref_cell->f2n[0x14] = 4;
    ref_cell->f2n[0x15] = 7;
    ref_cell->f2n[0x16] = 6;
    ref_cell->f2n[0x17] = 5;
    break;
  default:
    return 6;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cell_initialize(REF_CELL ref_cell,
                                              REF_CELL_TYPE type) {
  ref_cell_type(ref_cell) = type;

  ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_TRUE;
      break;
    case REF_CELL_TET:
    case REF_CELL_PYR:
    case REF_CELL_PRI:
    case REF_CELL_HEX:
    case REF_CELL_TE2:
    case REF_CELL_PY2:
    case REF_CELL_PR2:
    case REF_CELL_HE2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
      ref_cell_node_per(ref_cell) = 2;
      break;
    case REF_CELL_ED2:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_ED3:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_TRI:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_TR2:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_TR3:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_QUA:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_QU2:
      ref_cell_node_per(ref_cell) = 9;
      break;
    case REF_CELL_TET:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
      ref_cell_node_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_HEX:
      ref_cell_node_per(ref_cell) = 8;
      break;
    case REF_CELL_TE2:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_PY2:
      ref_cell_node_per(ref_cell) = 14;
      break;
    case REF_CELL_PR2:
      ref_cell_node_per(ref_cell) = 18;
      break;
    case REF_CELL_HE2:
      ref_cell_node_per(ref_cell) = 27;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell_size_per(ref_cell) = ref_cell_node_per(ref_cell) +
                                (ref_cell_last_node_is_an_id(ref_cell) ? 1 : 0);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_edge_per(ref_cell) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_edge_per(ref_cell) = 3;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_edge_per(ref_cell) = 4;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_edge_per(ref_cell) = 6;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_edge_per(ref_cell) = 8;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_edge_per(ref_cell) = 9;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_edge_per(ref_cell) = 12;
      break;
    default:
      ref_cell_edge_per(ref_cell) = 0;
      break;
  }

  ref_cell->e2n = NULL;
  if (ref_cell_edge_per(ref_cell) > 0)
    ref_malloc(ref_cell->e2n, 2 * ref_cell_edge_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 0;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 4;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 9) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 9) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 10) = 5;
      ref_cell_e2n_gen(ref_cell, 1, 10) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 11) = 6;
      ref_cell_e2n_gen(ref_cell, 1, 11) = 7;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_face_per(ref_cell) = 0;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_face_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_face_per(ref_cell) = 6;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell->f2n = NULL;
  if (ref_cell_face_per(ref_cell) > 0)
    ref_malloc(ref_cell->f2n, 4 * ref_cell_face_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 3;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 1;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 1;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);

      ref_cell_f2n_gen(ref_cell, 0, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = ref_cell_f2n_gen(ref_cell, 0, 4);
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 4;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 6;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 3) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 5) = 4;
      ref_cell_f2n_gen(ref_cell, 1, 5) = 7;
      ref_cell_f2n_gen(ref_cell, 2, 5) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 5) = 5;
      break;
    default:
      return REF_IMPLEMENT;
  }

  return REF_SUCCESS;
}